

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O2

void __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::init_asio
          (endpoint<websocketpp::config::asio::transport_config> *this,io_service_ptr ptr,
          error_code *ec)

{
  error_category *peVar1;
  size_t in_RCX;
  int iVar2;
  __shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (this->m_state == UNINITIALIZED) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x400,"asio::init_asio",in_RCX);
    this->m_io_service = ptr;
    this->m_external_io_service = true;
    std::
    make_shared<asio::basic_socket_acceptor<asio::ip::tcp>,std::reference_wrapper<asio::io_context>>
              ((reference_wrapper<asio::io_context> *)&local_30);
    std::__shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&(this->m_acceptor).
               super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    this->m_state = READY;
    iVar2 = 0;
    peVar1 = (error_category *)std::_V2::system_category();
  }
  else {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              ((this->m_elog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,2,"asio::init_asio called from the wrong state",in_RCX);
    iVar2 = 9;
    peVar1 = websocketpp::error::get_category();
  }
  ec->_M_value = iVar2;
  ec->_M_cat = peVar1;
  return;
}

Assistant:

void init_asio(io_service_ptr ptr, lib::error_code & ec) {
        if (m_state != UNINITIALIZED) {
            m_elog->write(log::elevel::library,
                "asio::init_asio called from the wrong state");
            using websocketpp::error::make_error_code;
            ec = make_error_code(websocketpp::error::invalid_state);
            return;
        }

        m_alog->write(log::alevel::devel,"asio::init_asio");

        m_io_service = ptr;
        m_external_io_service = true;
        m_acceptor = lib::make_shared<lib::asio::ip::tcp::acceptor>(
            lib::ref(*m_io_service));

        m_state = READY;
        ec = lib::error_code();
    }